

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

void __thiscall
unodb::
db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
::
decrement_inode_count<unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
           *this)

{
  if (*(long *)(this + 0x18) == 0) {
    __assert_fail("node_counts[as_i<INode::type>] > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                  ,0x5e0,
                  "void unodb::db<std::span<const std::byte>, std::span<const std::byte>>::decrement_inode_count() [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                 );
  }
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + -1;
  if (0x2f < *(ulong *)(this + 8)) {
    *(ulong *)(this + 8) = *(ulong *)(this + 8) - 0x30;
    return;
  }
  __assert_fail("delta <= current_memory_use",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x25d,
                "void unodb::db<std::span<const std::byte>, std::span<const std::byte>>::decrease_memory_use(std::size_t) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

constexpr void db<Key, Value>::decrement_inode_count() noexcept {
  static_assert(inode_defs_type::template is_inode<INode>());
  UNODB_DETAIL_ASSERT(node_counts[as_i<INode::type>] > 0);

  --node_counts[as_i<INode::type>];
  decrease_memory_use(sizeof(INode));
}